

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int mbedtls_md5_ret(uchar *input,size_t ilen,uchar *output)

{
  int iVar1;
  undefined1 local_7c [8];
  mbedtls_md5_context ctx;
  int ret;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer[0x38] = 0x92;
  ctx.buffer[0x39] = 0xff;
  ctx.buffer[0x3a] = 0xff;
  ctx.buffer[0x3b] = 0xff;
  unique0x10000099 = output;
  mbedtls_md5_init((mbedtls_md5_context *)local_7c);
  ctx.buffer._56_4_ = mbedtls_md5_starts_ret((mbedtls_md5_context *)local_7c);
  if ((ctx.buffer._56_4_ == 0) &&
     (ctx.buffer._56_4_ = mbedtls_md5_update_ret((mbedtls_md5_context *)local_7c,input,ilen),
     ctx.buffer._56_4_ == 0)) {
    ctx.buffer._56_4_ =
         mbedtls_md5_finish_ret((mbedtls_md5_context *)local_7c,stack0xffffffffffffffe0);
  }
  mbedtls_md5_free((mbedtls_md5_context *)local_7c);
  iVar1._0_1_ = ctx.buffer[0x38];
  iVar1._1_1_ = ctx.buffer[0x39];
  iVar1._2_1_ = ctx.buffer[0x3a];
  iVar1._3_1_ = ctx.buffer[0x3b];
  return iVar1;
}

Assistant:

int mbedtls_md5_ret( const unsigned char *input,
                     size_t ilen,
                     unsigned char output[16] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_md5_context ctx;

    mbedtls_md5_init( &ctx );

    if( ( ret = mbedtls_md5_starts_ret( &ctx ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_md5_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_md5_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_md5_free( &ctx );

    return( ret );
}